

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall
Printer_prettyPrintRandom_Test::~Printer_prettyPrintRandom_Test
          (Printer_prettyPrintRandom_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, prettyPrintRandom)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component5 = libcellml::Component::create("component");
    model->addComponent(component5);
    const std::string equation5 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply>          "
        "<eq/><apply><diff/><bvar><ci>   t\n\n\t\t</ci></bvar>\n\n<ci>X</ci></apply>"
        "<apply><minus/><apply><times/><ci>     alpha_X</ci>             \n<apply><minus/>\n\n\n"
        "<cn cellml:units=\"dimensionless\">1</cn><ci>X     </ci></apply></apply><apply><times/>"
        "<ci>beta_X</ci><ci>X</ci></apply>\n\n\n</apply></apply></math>";
    component5->setMath(equation5);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}